

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alloccommon.c
# Opt level: O0

void av1_alloc_restoration_buffers(AV1_COMMON *cm,_Bool is_sgr_enabled)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  int32_t *piVar8;
  RestorationLineBuffers *pRVar9;
  RestorationStripeBoundaries *pRVar10;
  uint8_t *puVar11;
  byte in_SIL;
  AV1_COMMON *in_RDI;
  RestorationStripeBoundaries *boundaries;
  int buf_size;
  int stride;
  int plane_w;
  int ss_x;
  int is_uv;
  int p;
  int use_highbd;
  int frame_w;
  int num_stripes;
  int ext_h;
  int mi_h;
  int num_planes;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 uVar12;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_28;
  
  iVar4 = av1_num_planes(in_RDI);
  if ((in_RDI->rst_tmpbuf == (int32_t *)0x0) && ((in_SIL & 1) != 0)) {
    piVar8 = (int32_t *)
             aom_memalign(CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    in_RDI->rst_tmpbuf = piVar8;
    if (in_RDI->rst_tmpbuf == (int32_t *)0x0) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rst_tmpbuf");
    }
  }
  if (in_RDI->rlbs == (RestorationLineBuffers *)0x0) {
    pRVar9 = (RestorationLineBuffers *)aom_malloc(0x6b2430);
    in_RDI->rlbs = pRVar9;
    if (in_RDI->rlbs == (RestorationLineBuffers *)0x0) {
      aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,"Failed to allocate cm->rlbs");
    }
  }
  iVar2 = (in_RDI->mi_params).mi_rows;
  iVar3 = in_RDI->superres_upscaled_width;
  bVar1 = in_RDI->seq_params->use_highbitdepth;
  for (local_28 = 0; local_28 < iVar4; local_28 = local_28 + 1) {
    uVar12 = false;
    if (0 < local_28) {
      uVar12 = in_RDI->seq_params->subsampling_x != 0;
    }
    iVar5 = (int)(iVar3 + (uint)(byte)uVar12) >> uVar12;
    iVar6 = iVar5 + 8;
    uVar7 = iVar5 + 0x27U & 0xffffffe0;
    iVar5 = ((iVar2 * 4 + 0x47) / 0x40) * uVar7 * 2 << (bVar1 & 0x1f);
    pRVar10 = &in_RDI->rst_info[local_28].boundaries;
    if (((iVar5 != in_RDI->rst_info[local_28].boundaries.stripe_boundary_size) ||
        (pRVar10->stripe_boundary_above == (uint8_t *)0x0)) ||
       (in_RDI->rst_info[local_28].boundaries.stripe_boundary_below == (uint8_t *)0x0)) {
      aom_free((void *)CONCAT17(uVar12,in_stack_ffffffffffffffb0));
      aom_free((void *)CONCAT17(uVar12,in_stack_ffffffffffffffb0));
      puVar11 = (uint8_t *)
                aom_memalign(CONCAT44(iVar6,uVar7),CONCAT44(iVar5,in_stack_ffffffffffffffc0));
      pRVar10->stripe_boundary_above = puVar11;
      if (pRVar10->stripe_boundary_above == (uint8_t *)0x0) {
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_above");
      }
      puVar11 = (uint8_t *)
                aom_memalign(CONCAT44(iVar6,uVar7),CONCAT44(iVar5,in_stack_ffffffffffffffc0));
      in_RDI->rst_info[local_28].boundaries.stripe_boundary_below = puVar11;
      if (in_RDI->rst_info[local_28].boundaries.stripe_boundary_below == (uint8_t *)0x0) {
        aom_internal_error(in_RDI->error,AOM_CODEC_MEM_ERROR,
                           "Failed to allocate boundaries->stripe_boundary_below");
      }
      in_RDI->rst_info[local_28].boundaries.stripe_boundary_size = iVar5;
    }
    in_RDI->rst_info[local_28].boundaries.stripe_boundary_stride = uVar7;
  }
  return;
}

Assistant:

void av1_alloc_restoration_buffers(AV1_COMMON *cm, bool is_sgr_enabled) {
  const int num_planes = av1_num_planes(cm);

  if (cm->rst_tmpbuf == NULL && is_sgr_enabled) {
    CHECK_MEM_ERROR(cm, cm->rst_tmpbuf,
                    (int32_t *)aom_memalign(16, RESTORATION_TMPBUF_SIZE));
  }

  if (cm->rlbs == NULL) {
    CHECK_MEM_ERROR(cm, cm->rlbs, aom_malloc(sizeof(RestorationLineBuffers)));
  }

  // For striped loop restoration, we divide each plane into "stripes",
  // of height 64 luma pixels but with an offset by RESTORATION_UNIT_OFFSET
  // luma pixels to match the output from CDEF. We will need to store 2 *
  // RESTORATION_CTX_VERT lines of data for each stripe.
  int mi_h = cm->mi_params.mi_rows;
  const int ext_h = RESTORATION_UNIT_OFFSET + (mi_h << MI_SIZE_LOG2);
  const int num_stripes = (ext_h + 63) / 64;

  // Now we need to allocate enough space to store the line buffers for the
  // stripes
  const int frame_w = cm->superres_upscaled_width;
  const int use_highbd = cm->seq_params->use_highbitdepth;

  for (int p = 0; p < num_planes; ++p) {
    const int is_uv = p > 0;
    const int ss_x = is_uv && cm->seq_params->subsampling_x;
    const int plane_w = ((frame_w + ss_x) >> ss_x) + 2 * RESTORATION_EXTRA_HORZ;
    const int stride = ALIGN_POWER_OF_TWO(plane_w, 5);
    const int buf_size = num_stripes * stride * RESTORATION_CTX_VERT
                         << use_highbd;
    RestorationStripeBoundaries *boundaries = &cm->rst_info[p].boundaries;

    if (buf_size != boundaries->stripe_boundary_size ||
        boundaries->stripe_boundary_above == NULL ||
        boundaries->stripe_boundary_below == NULL) {
      aom_free(boundaries->stripe_boundary_above);
      aom_free(boundaries->stripe_boundary_below);

      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_above,
                      (uint8_t *)aom_memalign(32, buf_size));
      CHECK_MEM_ERROR(cm, boundaries->stripe_boundary_below,
                      (uint8_t *)aom_memalign(32, buf_size));

      boundaries->stripe_boundary_size = buf_size;
    }
    boundaries->stripe_boundary_stride = stride;
  }
}